

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  uint32_t i;
  uint32_t val;
  Roaring r1;
  
  roaring::Roaring::Roaring(&r1);
  for (val = 100; val != 1000; val = val + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)&r1,val);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"cardinality = ");
  roaring_bitmap_get_cardinality((roaring_bitmap_t *)&r1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  roaring::Roaring::~Roaring(&r1);
  return 0;
}

Assistant:

int main() {
  Roaring r1;
  for (uint32_t i = 100; i < 1000; i++) {
    r1.add(i);
  }
  std::cout << "cardinality = " << r1.cardinality() << std::endl;

  return 0;
}